

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lptree.c
# Opt level: O2

int checkloops(TTree *tree)

{
  int iVar1;
  byte bVar2;
  
  while( true ) {
    bVar2 = tree->tag;
    if (bVar2 == 5) {
      iVar1 = checkaux(tree + 1,0);
      if (iVar1 != 0) {
        return 1;
      }
      bVar2 = tree->tag;
    }
    if (bVar2 == 0xd) break;
    if (""[bVar2] == '\x02') {
      iVar1 = checkloops(tree + 1);
      if (iVar1 != 0) {
        return 1;
      }
      tree = tree + (tree->u).ps;
    }
    else {
      if (""[bVar2] != '\x01') {
        return 0;
      }
      tree = tree + 1;
    }
  }
  return 0;
}

Assistant:

static int checkloops (TTree *tree) {
 tailcall:
  if (tree->tag == TRep && nullable(sib1(tree)))
    return 1;
  else if (tree->tag == TGrammar)
    return 0;  /* sub-grammars already checked */
  else {
    switch (numsiblings[tree->tag]) {
      case 1:  /* return checkloops(sib1(tree)); */
        tree = sib1(tree); goto tailcall;
      case 2:
        if (checkloops(sib1(tree))) return 1;
        /* else return checkloops(sib2(tree)); */
        tree = sib2(tree); goto tailcall;
      default: assert(numsiblings[tree->tag] == 0); return 0;
    }
  }
}